

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::SubmitCommandBuffer::~SubmitCommandBuffer(SubmitCommandBuffer *this)

{
  CmdCommand *pCVar1;
  DeviceInterface *pDVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  ulong uVar5;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR__SubmitCommandBuffer_00d2eee8;
  ppCVar4 = (this->m_commands).
            super__Vector_base<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar3 = (this->m_commands).
            super__Vector_base<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar3 != ppCVar4) {
    uVar5 = 0;
    do {
      pCVar1 = ppCVar4[uVar5];
      if (pCVar1 != (CmdCommand *)0x0) {
        (*pCVar1->_vptr_CmdCommand[1])(pCVar1);
        ppCVar4 = (this->m_commands).
                  super__Vector_base<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppCVar3 = (this->m_commands).
                  super__Vector_base<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)ppCVar3 - (long)ppCVar4 >> 3));
  }
  if ((this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkCommandBuffer_s *)0x0) {
    pDVar2 = (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
             m_deviceIface;
    (*pDVar2->_vptr_DeviceInterface[0x48])
              (pDVar2,(this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                      m_device,
               (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal,1);
    ppCVar4 = (this->m_commands).
              super__Vector_base<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       0;
  (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (ppCVar4 != (pointer)0x0) {
    operator_delete(ppCVar4,(long)(this->m_commands).
                                  super__Vector_base<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar4
                   );
  }
  return;
}

Assistant:

SubmitCommandBuffer::~SubmitCommandBuffer (void)
{
	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
		delete m_commands[cmdNdx];
}